

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_hash.c
# Opt level: O1

void sylvan_init_hash(void)

{
  ulong uVar1;
  int i;
  uint64_t x;
  long lVar2;
  uint64_t *puVar3;
  INT96 r;
  uint64_t local_48;
  long local_40;
  ulong local_38;
  
  puVar3 = sylvan_tabhash_table;
  x = 0;
  do {
    MultAddPrime89(&local_48,x,(uint64_t *)&DAT_00121e80,(uint64_t *)&DAT_00121ea0);
    MultAddPrime89(&local_48,x,&local_48,(uint64_t *)&DAT_00121ec0);
    MultAddPrime89(&local_48,x,&local_48,(uint64_t *)&DAT_00121ee0);
    MultAddPrime89(&local_48,x,&local_48,(uint64_t *)&DAT_00121f00);
    MultAddPrime89(&local_48,x,&local_48,(uint64_t *)&DAT_00121f20);
    MultAddPrime89(&local_48,x,&local_48,(uint64_t *)&DAT_00121f40);
    MultAddPrime89(&local_48,x,&local_48,(uint64_t *)&DAT_00121f60);
    MultAddPrime89(&local_48,x,&local_48,(uint64_t *)&DAT_00121f80);
    MultAddPrime89(&local_48,x,&local_48,(uint64_t *)&DAT_00121fa0);
    MultAddPrime89(&local_48,x,&local_48,(uint64_t *)&DAT_00121fc0);
    MultAddPrime89(&local_48,x,&local_48,(uint64_t *)&DAT_00121fe0);
    uVar1 = (local_38 >> 0x19) + local_48;
    lVar2 = local_40 << 0x20;
    if (0xfffffffe < uVar1) {
      lVar2 = -0xffffffff;
    }
    if (local_40 != 0xffffffff || (~(uint)local_38 & 0x1ffffff) != 0) {
      lVar2 = local_40 << 0x20;
    }
    *puVar3 = lVar2 + uVar1;
    x = x + 1;
    puVar3 = puVar3 + 1;
  } while (x != 0x1000);
  return;
}

Assistant:

void
sylvan_init_hash(void)
{
    // initialize sylvan_tabhash_table
    for (int i=0; i<256*16; i++) sylvan_tabhash_table[i] = CWhash(i);
}